

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

bb_insn_t_conflict get_def(gen_ctx_t gen_ctx,MIR_reg_t reg,bb_t_conflict bb)

{
  MIR_item_t_conflict *ppMVar1;
  uint uVar2;
  MIR_context_t pMVar3;
  VARR_bb_insn_t *pVVar4;
  bitmap_t pVVar5;
  VARR_char *pVVar6;
  undefined8 uVar7;
  def_tab_el_t el_00;
  def_tab_el_t el_01;
  int iVar8;
  MIR_type_t MVar9;
  in_edge_t_conflict peVar10;
  gen_ctx_t pgVar11;
  MIR_insn_t_conflict pMVar12;
  bb_insn_t_conflict *__ptr;
  bitmap_el_t *pbVar13;
  char *pcVar14;
  MIR_item_t pMVar15;
  bb_insn_t_conflict pbVar16;
  long lVar17;
  ulong uVar18;
  uint *puVar19;
  gen_ctx *pgVar20;
  uint uVar21;
  uint var;
  in_edge_t peVar22;
  ulong uVar23;
  def_tab_el_t *res;
  uint *puVar24;
  gen_ctx *pgVar25;
  bitmap_t pVVar26;
  VARR_char *pVVar27;
  size_t sVar28;
  uint uVar29;
  MIR_insn_code_t code;
  gen_ctx_t ctx;
  gen_ctx_t pgVar30;
  gen_ctx_t gen_ctx_00;
  uint uVar31;
  VARR_MIR_op_t *pVVar32;
  gen_ctx *pgVar33;
  uint uVar34;
  def_tab_el_t *pdVar35;
  c2mir_ctx *pcVar36;
  ulong uVar37;
  def_tab_el_t el;
  def_tab_el_t tab_el;
  bb_t_conflict pbVar38;
  bb_insn_t_conflict pbStack_d0;
  undefined4 uStack_bc;
  bb_insn_t_conflict local_b8;
  def_tab_el_t local_b0;
  MIR_context_t pMStack_98;
  uint uStack_90;
  undefined4 uStack_8c;
  MIR_item_t_conflict local_88;
  FILE *pFStack_80;
  int iStack_78;
  undefined4 uStack_74;
  VARR_void_ptr_t *pVStack_70;
  MIR_context_t local_68;
  uint uStack_60;
  undefined4 uStack_5c;
  MIR_item_t_conflict pMStack_58;
  FILE *pFStack_50;
  int iStack_48;
  undefined4 uStack_44;
  VARR_void_ptr_t *pVStack_40;
  
  ctx = (gen_ctx_t)gen_ctx->ctx;
  pbVar38 = (bb_t_conflict)CONCAT44(uStack_bc,reg);
  el_00._8_8_ = pbVar38;
  el_00.bb = bb;
  el_00.def = local_b8;
  iVar8 = HTAB_def_tab_el_t_do(gen_ctx->ssa_ctx->def_tab,el_00,HTAB_FIND,&local_b0);
  if (iVar8 != 0) {
    return local_b0.def;
  }
  peVar10 = (bb->in_edges).head;
  if (peVar10 != (in_edge_t_conflict)0x0) {
    lVar17 = 1;
    peVar22 = peVar10;
    do {
      peVar22 = (peVar22->in_link).next;
      lVar17 = lVar17 + -1;
    } while (peVar22 != (in_edge_t)0x0);
    if (lVar17 == 0) {
      if (peVar10->src->index != 0) {
        pbVar16 = get_def(gen_ctx,reg,peVar10->src);
        return pbVar16;
      }
      pbVar16 = get_fake_insn(gen_ctx,gen_ctx->ssa_ctx->arg_bb_insns,reg);
      return pbVar16;
    }
  }
  pgVar30 = (gen_ctx_t)&stack0xffffffffffffff98;
  _MIR_new_var_op((MIR_context_t)ctx,reg);
  uVar37 = 1;
  iStack_78 = iStack_48;
  uStack_74 = uStack_44;
  pVStack_70 = pVStack_40;
  pMStack_98 = local_68;
  uStack_90 = uStack_60;
  uStack_8c = uStack_5c;
  local_88 = pMStack_58;
  pFStack_80 = pFStack_50;
  for (peVar10 = (bb->in_edges).head; peVar10 != (in_edge_t_conflict)0x0;
      peVar10 = (peVar10->in_link).next) {
    uVar37 = uVar37 + 1;
  }
  pVVar32 = gen_ctx->temp_ops;
  if ((pVVar32 == (VARR_MIR_op_t *)0x0) || (pVVar32->varr == (MIR_op_t *)0x0)) {
LAB_00160635:
    get_def_cold_4();
  }
  else {
    pMVar3 = gen_ctx->ctx;
    pVVar32->els_num = 0;
    do {
      uVar18 = pVVar32->els_num;
      if (uVar37 <= uVar18) goto LAB_0016051a;
      pgVar11 = (gen_ctx_t)pVVar32->varr;
      if (pgVar11 == (gen_ctx_t)0x0) {
        get_def_cold_3();
        goto LAB_00160635;
      }
      uVar23 = uVar18 + 1;
      if (pVVar32->size <= uVar18) {
        sVar28 = (uVar23 >> 1) + uVar23;
        ctx = (gen_ctx_t)(sVar28 * 0x30);
        pgVar30 = pgVar11;
        pgVar11 = (gen_ctx_t)realloc(pgVar11,(size_t)ctx);
        pVVar32->varr = (MIR_op_t *)pgVar11;
        pVVar32->size = sVar28;
        uVar18 = pVVar32->els_num;
        uVar23 = uVar18 + 1;
      }
      pVVar32->els_num = uVar23;
      ppMVar1 = (MIR_item_t_conflict *)(pgVar11->call_used_hard_regs + uVar18 * 6 + -0xb);
      *ppMVar1 = local_88;
      ppMVar1[1] = (MIR_item_t_conflict)pFStack_80;
      ppMVar1[2] = (MIR_item_t_conflict)_iStack_78;
      ppMVar1[3] = (MIR_item_t_conflict)pVStack_70;
      ppMVar1 = (MIR_item_t_conflict *)(pgVar11->call_used_hard_regs + uVar18 * 6 + -0xd);
      *ppMVar1 = (MIR_item_t_conflict)pMStack_98;
      ppMVar1[1] = (MIR_item_t_conflict)_uStack_90;
      ppMVar1[2] = local_88;
      ppMVar1[3] = (MIR_item_t_conflict)pFStack_80;
      pVVar32 = gen_ctx->temp_ops;
    } while (pVVar32 != (VARR_MIR_op_t *)0x0);
    get_def_cold_2();
LAB_0016051a:
    pMVar12 = MIR_new_insn_arr(pMVar3,MIR_PHI,uVar37,pVVar32->varr);
    ctx = (gen_ctx_t)((bb->bb_insns).head)->insn;
    pgVar30 = gen_ctx;
    if (*(int *)&ctx->debug_file == 0xb4) {
      gen_add_insn_after(gen_ctx,(MIR_insn_t)ctx,pMVar12);
    }
    else {
      gen_add_insn_before(gen_ctx,(MIR_insn_t)ctx,pMVar12);
    }
    pbVar16 = (bb_insn_t_conflict)pMVar12->data;
    pMVar12->ops[0].data = pbVar16;
    pVVar4 = gen_ctx->ssa_ctx->phis;
    __ptr = pVVar4->varr;
    if (__ptr != (bb_insn_t_conflict *)0x0) {
      sVar28 = pVVar4->els_num;
      uVar37 = sVar28 + 1;
      if (pVVar4->size < uVar37) {
        sVar28 = (uVar37 >> 1) + uVar37;
        __ptr = (bb_insn_t_conflict *)realloc(__ptr,sVar28 * 8);
        pVVar4->varr = __ptr;
        pVVar4->size = sVar28;
        sVar28 = pVVar4->els_num;
        uVar37 = sVar28 + 1;
      }
      pVVar4->els_num = uVar37;
      __ptr[sVar28] = pbVar16;
      el_01._12_4_ = uStack_bc;
      el_01.reg = reg;
      el_01.bb = bb;
      el_01.def = pbVar16;
      HTAB_def_tab_el_t_do(gen_ctx->ssa_ctx->def_tab,el_01,HTAB_INSERT,&local_b0);
      return pbVar16;
    }
  }
  get_def_cold_1();
  pVVar5 = pgVar30->tied_regs;
  if (pVVar5 == (bitmap_t)0x0) {
    HTAB_def_tab_el_t_do_cold_8();
    pgVar11 = ctx;
LAB_001609f7:
    HTAB_def_tab_el_t_do_cold_7();
LAB_001609fc:
    HTAB_def_tab_el_t_do_cold_4();
    gen_ctx_00 = pgVar30;
LAB_00160a01:
    pgVar30 = pgVar11;
    HTAB_def_tab_el_t_do_cold_3();
LAB_00160a06:
    HTAB_def_tab_el_t_do_cold_5();
LAB_00160a0b:
    HTAB_def_tab_el_t_do_cold_6();
LAB_00160a10:
    HTAB_def_tab_el_t_do_cold_1();
  }
  else {
    pgVar11 = pgVar30;
    if (*(VARR_char **)&pgVar30->addr_insn_p == (VARR_char *)0x0) goto LAB_001609f7;
    pMVar15 = pgVar30->curr_func_item;
    uVar29 = (uint)pVVar5->els_num;
    uVar21 = (int)ctx - 1;
    uVar31 = uVar29;
    if ((1 < uVar21) ||
       (iVar8 = (int)(*(VARR_char **)&pgVar30->addr_insn_p)->els_num,
       pgVar30->optimize_level != iVar8)) {
LAB_0016080c:
      iVar8 = (*(code *)pgVar30->debug_file)(pMVar15);
      uVar29 = iVar8 + (uint)(iVar8 == 0);
      pgVar11 = (gen_ctx_t)(ulong)uVar29;
      if (pgVar30->tied_regs == (bitmap_t)0x0) goto LAB_001609fc;
      gen_ctx_00 = pgVar30;
      if (*(VARR_char **)&pgVar30->addr_insn_p != (VARR_char *)0x0) {
        pbVar13 = pgVar30->tied_regs->varr;
        pcVar14 = (*(VARR_char **)&pgVar30->addr_insn_p)->varr;
        puVar24 = (uint *)0x0;
        uVar34 = uVar29;
        do {
          uVar34 = uVar34 & uVar31 - 1;
          puVar19 = (uint *)((long)pbVar13 + (ulong)uVar34 * 4);
          uVar2 = *puVar19;
          if ((ulong)uVar2 != 0xfffffffe) {
            if (uVar2 == 0xffffffff) {
              if (1 < uVar21) {
                return (bb_insn_t_conflict)0x0;
              }
              *(int *)&pgVar30->ctx = *(int *)&pgVar30->ctx + 1;
              if (puVar24 != (uint *)0x0) {
                puVar19 = puVar24;
              }
              lVar17 = (ulong)pgVar30->optimize_level * 0x20;
              *(uint *)(pcVar14 + lVar17) = uVar29;
              *(bb_t_conflict *)(pcVar14 + lVar17 + 8) = pbVar38;
              *(bb_insn_t_conflict *)(pcVar14 + lVar17 + 8 + 8) = local_b8;
              *(bb_insn_t_conflict *)(pcVar14 + lVar17 + 0x18) = pbStack_d0;
              uVar29 = pgVar30->optimize_level;
              pgVar30->optimize_level = uVar29 + 1;
              *puVar19 = uVar29;
              res->def = pbStack_d0;
              res->bb = pbVar38;
              *(bb_insn_t_conflict *)&res->reg = local_b8;
              return (bb_insn_t_conflict)0x0;
            }
            lVar17 = (ulong)uVar2 * 0x20;
            puVar19 = puVar24;
            if ((*(uint *)(pcVar14 + lVar17) == uVar29) &&
               (iVar8 = (*(code *)*(VARR_size_t **)&pgVar30->debug_level)(pMVar15), iVar8 != 0)) {
              if ((int)ctx == 2) {
                if ((VARR_MIR_proto_t *)pgVar30->to_free != (VARR_MIR_proto_t *)0x0) {
                  (*(code *)pgVar30->to_free)(pMVar15);
                }
                *(bb_insn_t_conflict *)(pcVar14 + lVar17 + 0x18) = pbStack_d0;
                *(bb_t_conflict *)(pcVar14 + lVar17 + 8) = pbVar38;
                *(bb_insn_t_conflict *)(pcVar14 + lVar17 + 0x10) = local_b8;
              }
              res->def = *(bb_insn_t_conflict *)(pcVar14 + lVar17 + 0x18);
              uVar7 = *(undefined8 *)(pcVar14 + lVar17 + 0x10);
              res->bb = *(bb_t_conflict *)(pcVar14 + lVar17 + 8);
              *(undefined8 *)&res->reg = uVar7;
              return (bb_insn_t_conflict)&DAT_00000001;
            }
          }
          *(int *)&pgVar30->field_0xc = *(int *)&pgVar30->field_0xc + 1;
          pgVar11 = (gen_ctx_t)((ulong)pgVar11 >> 0xb);
          uVar34 = (int)pgVar11 + 1 + uVar34 * 5;
          puVar24 = puVar19;
        } while( true );
      }
      goto LAB_00160a01;
    }
    gen_ctx_00 = (gen_ctx_t)pVVar5->varr;
    if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_00160a0b;
    uVar31 = uVar29 * 2;
    uVar37 = (ulong)uVar31;
    if (pVVar5->size != uVar37) {
      pbVar13 = (bitmap_el_t *)realloc(gen_ctx_00,uVar37 * 4);
      pVVar5->varr = pbVar13;
      pVVar26 = pgVar30->tied_regs;
      pVVar5->size = uVar37;
      pVVar5->els_num = uVar37;
      if (pVVar26 != (bitmap_t)0x0) goto LAB_001606ec;
      goto LAB_00160a10;
    }
    pVVar5->els_num = uVar37;
    pVVar26 = pVVar5;
LAB_001606ec:
    if (uVar31 != 0) {
      gen_ctx_00 = (gen_ctx_t)pVVar26->varr;
      memset(gen_ctx_00,0xff,(ulong)(uVar29 & 0x7fffffff) << 3);
    }
    pVVar6 = *(VARR_char **)&pgVar30->addr_insn_p;
    if ((pVVar6 == (VARR_char *)0x0) ||
       (gen_ctx_00 = (gen_ctx_t)pVVar6->varr, gen_ctx_00 == (gen_ctx_t)0x0)) goto LAB_00160a06;
    uVar37 = (ulong)(uint)(iVar8 * 2);
    if (pVVar6->size == uVar37) {
      pVVar6->els_num = uVar37;
      pVVar27 = pVVar6;
LAB_00160769:
      pcVar14 = pVVar27->varr;
      uVar29 = *(uint *)((long)&pgVar30->ctx + 4);
      uVar34 = pgVar30->optimize_level;
      *(undefined4 *)&pgVar30->ctx = 0;
      pgVar30->optimize_level = 0;
      *(undefined4 *)((long)&pgVar30->ctx + 4) = 0;
      if (uVar29 < uVar34) {
        iVar8 = uVar34 - uVar29;
        pdVar35 = (def_tab_el_t *)(pcVar14 + (ulong)uVar29 * 0x20 + 8);
        do {
          if (*(int *)&pdVar35[-1].def != 0) {
            HTAB_def_tab_el_t_do((HTAB_def_tab_el_t *)pgVar30,*pdVar35,HTAB_INSERT,res);
            (*(code *)*(VARR_size_t **)&pgVar30->debug_level)(pMVar15);
          }
          pdVar35 = (def_tab_el_t *)&pdVar35[1].reg;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      goto LAB_0016080c;
    }
    pcVar14 = (char *)realloc(gen_ctx_00,uVar37 << 5);
    pVVar6->varr = pcVar14;
    pVVar27 = *(VARR_char **)&pgVar30->addr_insn_p;
    pVVar6->size = uVar37;
    pVVar6->els_num = uVar37;
    if (pVVar27 != (VARR_char *)0x0) goto LAB_00160769;
  }
  HTAB_def_tab_el_t_do_cold_2();
  pbVar38 = (gen_ctx_00->curr_cfg->bbs).head;
  if (pbVar38->index != 0) {
LAB_00160b8a:
    __assert_fail("bb->index == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x897,"bb_insn_t get_fake_insn(gen_ctx_t, VARR_bb_insn_t *, MIR_reg_t)");
  }
  pMVar3 = gen_ctx_00->ctx;
  _MIR_new_var_op(pMVar3,var);
  if (pgVar30 == (gen_ctx_t)0x0) {
    get_fake_insn_cold_4();
LAB_00160bae:
    get_fake_insn_cold_3();
  }
  else {
    pgVar33 = (gen_ctx *)(ulong)var;
    pgVar20 = (gen_ctx *)pgVar30->ctx;
    while (pgVar20 <= pgVar33) {
      pMVar15 = pgVar30->curr_func_item;
      if (pMVar15 == (MIR_item_t)0x0) {
        get_fake_insn_cold_1();
        goto LAB_00160b8a;
      }
      pgVar25 = (gen_ctx *)((long)&pgVar20->ctx + 1);
      if (*(gen_ctx **)&pgVar30->optimize_level <= pgVar20) {
        pcVar36 = (c2mir_ctx *)((long)pgVar25->call_used_hard_regs + (((ulong)pgVar25 >> 1) - 0x68))
        ;
        pMVar15 = (MIR_item_t)realloc(pMVar15,(long)pcVar36 * 8);
        pgVar30->curr_func_item = pMVar15;
        *(c2mir_ctx **)&pgVar30->optimize_level = pcVar36;
        pgVar20 = (gen_ctx *)pgVar30->ctx;
        pgVar25 = (gen_ctx *)((long)&pgVar20->ctx + 1);
      }
      pgVar30->ctx = (MIR_context_t)pgVar25;
      (&pMVar15->data)[(long)pgVar20] = (void *)0x0;
      pgVar20 = pgVar25;
    }
    if (pgVar30->curr_func_item == (MIR_item_t)0x0) goto LAB_00160bae;
    pbVar16 = (bb_insn_t_conflict)(&pgVar30->curr_func_item->data)[(long)pgVar33];
    if (pbVar16 != (bb_insn_t_conflict)0x0) {
      return pbVar16;
    }
    if (var < 0x22) goto LAB_00160bb8;
    MVar9 = MIR_reg_type(pMVar3,var - 0x21,(gen_ctx_00->curr_func_item->u).func);
    if (MVar9 == MIR_T_F) {
      code = MIR_FMOV;
    }
    else if (MVar9 == MIR_T_D) {
      code = MIR_DMOV;
    }
    else {
      code = (uint)(MVar9 == MIR_T_LD) * 3;
    }
    pMVar12 = MIR_new_insn(pMVar3,code);
    pbVar16 = create_bb_insn(gen_ctx_00,pMVar12,pbVar38);
    if ((pgVar30->curr_func_item != (MIR_item_t)0x0) && (pgVar33 < (gen_ctx *)pgVar30->ctx)) {
      (&pgVar30->curr_func_item->data)[(long)pgVar33] = pbVar16;
      return pbVar16;
    }
  }
  get_fake_insn_cold_2();
LAB_00160bb8:
  __assert_fail("reg > ST1_HARD_REG",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x89b,"bb_insn_t get_fake_insn(gen_ctx_t, VARR_bb_insn_t *, MIR_reg_t)");
}

Assistant:

static bb_insn_t get_def (gen_ctx_t gen_ctx, MIR_reg_t reg, bb_t bb) {
  MIR_context_t ctx = gen_ctx->ctx;
  bb_t src;
  bb_insn_t def;
  def_tab_el_t el, tab_el;
  MIR_op_t op;

  el.bb = bb;
  el.reg = reg;
  if (HTAB_DO (def_tab_el_t, def_tab, el, HTAB_FIND, tab_el)) return tab_el.def;
  if (DLIST_LENGTH (in_edge_t, bb->in_edges) == 1) {
    if ((src = DLIST_HEAD (in_edge_t, bb->in_edges)->src)->index == 0) { /* start bb: args */
      return get_fake_insn (gen_ctx, arg_bb_insns, reg);
    }
    return get_def (gen_ctx, reg, DLIST_HEAD (in_edge_t, bb->in_edges)->src);
  }
  op = _MIR_new_var_op (ctx, reg);
  el.def = def = create_phi (gen_ctx, bb, op);
  HTAB_DO (def_tab_el_t, def_tab, el, HTAB_INSERT, tab_el);
  return el.def;
}